

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmaps.cc
# Opt level: O1

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EmbeddedIterator *pEVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar12;
  Inner *pIVar13;
  ctrl_t *pcVar14;
  int i;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int i_4;
  long lVar18;
  void *pvVar19;
  slot_type *psVar20;
  string __str;
  string __str_2;
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> s;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_638;
  undefined8 uStack_600;
  iterator local_5f8;
  slot_type *psStack_5c8;
  undefined1 local_5c0 [8];
  undefined1 local_5b8 [8];
  undefined1 local_5b0 [24];
  _Head_base<0UL,_unsigned_long,_false> local_598 [3];
  __pthread_internal_list local_580 [85];
  
  local_5b0._0_8_ =
       phmap::priv::EmptyGroup<std::is_same<std::allocator<int>,std::allocator<int>>>()::empty_group
  ;
  uVar16 = 0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    local_638.first.inner_ = (Inner *)CONCAT44(local_638.first.inner_._4_4_,(int)uVar16);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
    ::emplace_decomposable<int,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_638,
               SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0),(int *)&local_638);
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   *)local_5b0);
  local_5b0._0_8_ =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>()
       ::empty_group;
  uVar15 = 0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  paVar1 = &local_678.first.field_2;
  do {
    uVar17 = 2 - (uVar15 < 10);
    local_678.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_678,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_678.first._M_dataplus._M_p,uVar17,uVar15);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_638,
               (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5b0,&local_678.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_678.first._M_dataplus._M_p);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5b0);
  local_5b0._0_8_ =
       phmap::priv::EmptyGroup<std::is_same<std::allocator<int>,std::allocator<int>>>()::empty_group
  ;
  uVar16 = 0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar16;
    local_638.first.inner_ = (Inner *)CONCAT44(local_638.first.inner_._4_4_,(int)uVar16);
    phmap::priv::
    raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
    ::emplace_decomposable<int,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_638,
               SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0),(int *)&local_638);
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   *)local_5b0);
  local_5b0._0_8_ =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>()
       ::empty_group;
  uVar15 = 0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  do {
    uVar17 = 2 - (uVar15 < 10);
    local_678.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_678,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_678.first._M_dataplus._M_p,uVar17,uVar15);
    phmap::priv::
    raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_638,
               (raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5b0,&local_678.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_678.first._M_dataplus._M_p);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5b0);
  local_5b0._0_8_ =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
       ::empty_group;
  pIVar13 = (Inner *)0x0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  lVar18 = 100;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(int)pIVar13;
    local_638.first.inner_end_ = (Inner *)((long)&local_5f8.inner_ + 4);
    local_638.first.inner_ = (Inner *)&local_5f8;
    local_5f8.inner_ = pIVar13;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
    ::
    emplace_decomposable<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_5f8,
               SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_638,
               (tuple<int_&&> *)&local_638.first.inner_end_);
    pIVar13 = (Inner *)((long)&pIVar13[0x5555555].set_.size_ + 1);
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_5b0);
  local_678.first._M_dataplus._M_p =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>()
       ::empty_group;
  pvVar19 = (void *)0x0;
  local_678.second._M_string_length = 0;
  local_678.first._M_string_length = 0;
  local_678.first.field_2._M_allocated_capacity = 0;
  local_678.first.field_2._8_8_ = 0;
  uVar12 = extraout_RDX;
  do {
    main::$_3::operator()[abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0,pvVar19,(int)uVar12);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_638,
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_678,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0);
    uVar12 = extraout_RDX_00;
    if ((__pthread_internal_list *)local_598[1]._M_head_impl != local_580) {
      operator_delete((void *)local_598[1]._M_head_impl);
      uVar12 = extraout_RDX_01;
    }
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_);
      uVar12 = extraout_RDX_02;
    }
    uVar15 = (int)pvVar19 + 1;
    pvVar19 = (void *)(ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_678);
  local_5b0._0_8_ =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
       ::empty_group;
  pIVar13 = (Inner *)0x0;
  local_598[2]._M_head_impl = 0;
  local_5b0._8_8_ = (slot_type *)0x0;
  local_5b0._16_8_ = 0;
  local_598[0]._M_head_impl = 0;
  lVar18 = 100;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(int)pIVar13;
    local_638.first.inner_end_ = (Inner *)((long)&local_5f8.inner_ + 4);
    local_638.first.inner_ = (Inner *)&local_5f8;
    local_5f8.inner_ = pIVar13;
    phmap::priv::
    raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
    ::
    emplace_decomposable<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_5f8,
               SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_638,
               (tuple<int_&&> *)&local_638.first.inner_end_);
    pIVar13 = (Inner *)((long)&pIVar13[0x5555555].set_.size_ + 1);
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  phmap::priv::
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_5b0);
  local_678.first._M_dataplus._M_p =
       phmap::priv::
       EmptyGroup<std::is_same<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>()
       ::empty_group;
  pvVar19 = (void *)0x0;
  local_678.second._M_string_length = 0;
  local_678.first._M_string_length = 0;
  local_678.first.field_2._M_allocated_capacity = 0;
  local_678.first.field_2._8_8_ = 0;
  uVar12 = extraout_RDX_03;
  do {
    main::$_3::operator()[abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0,pvVar19,(int)uVar12);
    phmap::priv::
    raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_638,
               (raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_678,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b0);
    uVar12 = extraout_RDX_04;
    if ((__pthread_internal_list *)local_598[1]._M_head_impl != local_580) {
      operator_delete((void *)local_598[1]._M_head_impl);
      uVar12 = extraout_RDX_05;
    }
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_);
      uVar12 = extraout_RDX_06;
    }
    uVar15 = (int)pvVar19 + 1;
    pvVar19 = (void *)(ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::destroy_slots((raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_678);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::EmptyGroup<std::is_same<std::allocator<int>,std::allocator<int>>>()::
         empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  uVar16 = 0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar16;
    local_5f8.inner_ = (Inner *)CONCAT44(local_5f8.inner_._4_4_,(int)uVar16);
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
    ::emplace_decomposable_with_hash<int,int>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_5f8,
               SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),0),(int *)&local_5f8);
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  uVar15 = 0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  pEVar2 = &local_5f8.it_;
  do {
    uVar17 = 2 - (uVar15 < 10);
    local_5f8.inner_ = (Inner *)pEVar2;
    std::__cxx11::string::_M_construct((ulong)&local_5f8,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_5f8.inner_,uVar17,uVar15);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_678,
               (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5f8);
    if ((EmbeddedIterator *)local_5f8.inner_ != pEVar2) {
      operator_delete(local_5f8.inner_);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::EmptyGroup<std::is_same<std::allocator<int>,std::allocator<int>>>()::
         empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  uVar16 = 0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar16;
    local_5f8.inner_ = (Inner *)CONCAT44(local_5f8.inner_._4_4_,(int)uVar16);
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
    ::emplace_decomposable_with_hash<int,int>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)&local_5f8,
               SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0),(int *)&local_5f8);
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  uVar15 = 0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  do {
    uVar17 = 2 - (uVar15 < 10);
    local_5f8.inner_ = (Inner *)pEVar2;
    std::__cxx11::string::_M_construct((ulong)&local_5f8,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_5f8.inner_,uVar17,uVar15);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                *)&local_678,
               (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5f8);
    if ((EmbeddedIterator *)local_5f8.inner_ != pEVar2) {
      operator_delete(local_5f8.inner_);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  pcVar14 = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  lVar18 = 100;
  do {
    local_5f8.inner_ = (Inner *)local_5c0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)(int)pcVar14;
    local_5f8.inner_end_ = (Inner *)(local_5c0 + 4);
    local_5c0 = (undefined1  [8])pcVar14;
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
    ::
    emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)local_5f8.inner_,
               SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_5f8,
               (tuple<int_&&> *)&local_5f8.inner_end_);
    pcVar14 = pcVar14 + 0x100000001;
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  pvVar19 = (void *)0x0;
  local_5f8.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_5f8.inner_ = (Inner *)0x0;
  local_5f8.inner_end_ = (Inner *)0x0;
  local_5f8.it_.ctrl_ = (ctrl_t *)0x0;
  uVar12 = extraout_RDX_07;
  do {
    main::$_3::operator()[abi_cxx11_(&local_678,pvVar19,(int)uVar12);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (&local_638,
               (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_5b0,&local_678);
    uVar12 = extraout_RDX_08;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.second._M_dataplus._M_p != &local_678.second.field_2) {
      operator_delete(local_678.second._M_dataplus._M_p);
      uVar12 = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.first._M_dataplus._M_p != &local_678.first.field_2) {
      operator_delete(local_678.first._M_dataplus._M_p);
      uVar12 = extraout_RDX_10;
    }
    uVar15 = (int)pvVar19 + 1;
    pvVar19 = (void *)(ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_5f8.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_5f8.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_5f8.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_5f8.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::iterator::operator++(&local_5f8);
  local_5f8.inner_ = (Inner *)0x0;
  local_5f8.inner_end_ = (Inner *)0x0;
  local_5f8.it_.ctrl_ = (ctrl_t *)0x0;
  local_5f8.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_5f8.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_5f8.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_5f8.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_5f8.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_5f8.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&local_5f8);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  pcVar14 = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  lVar18 = 100;
  do {
    local_5f8.inner_ = (Inner *)local_5c0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)(int)pcVar14;
    local_5f8.inner_end_ = (Inner *)(local_5c0 + 4);
    local_5c0 = (undefined1  [8])pcVar14;
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
    ::
    emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                *)&local_678,local_5b0,(int *)local_5f8.inner_,
               SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_5f8,
               (tuple<int_&&> *)&local_5f8.inner_end_);
    pcVar14 = pcVar14 + 0x100000001;
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
              *)local_5b0);
  lVar18 = 0;
  do {
    *(undefined1 **)(local_5b0 + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_580 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 8) = 0;
    *(undefined8 *)(local_5b0 + lVar18 + 0x10) = 0;
    *(undefined8 *)((long)&local_598[0]._M_head_impl + lVar18) = 0;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0x300);
  pvVar19 = (void *)0x0;
  local_5f8.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_5f8.inner_ = (Inner *)0x0;
  local_5f8.inner_end_ = (Inner *)0x0;
  local_5f8.it_.ctrl_ = (ctrl_t *)0x0;
  uVar12 = extraout_RDX_11;
  do {
    main::$_3::operator()[abi_cxx11_(&local_678,pvVar19,(int)uVar12);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_638,
               (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_5b0,&local_678);
    uVar12 = extraout_RDX_12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.second._M_dataplus._M_p != &local_678.second.field_2) {
      operator_delete(local_678.second._M_dataplus._M_p);
      uVar12 = extraout_RDX_13;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678.first._M_dataplus._M_p != &local_678.first.field_2) {
      operator_delete(local_678.first._M_dataplus._M_p);
      uVar12 = extraout_RDX_14;
    }
    uVar15 = (int)pvVar19 + 1;
    pvVar19 = (void *)(ulong)uVar15;
  } while (uVar15 != 100);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_5f8.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_5f8.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_5f8.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_5f8.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::iterator::operator++((iterator *)&local_5f8);
  local_5f8.inner_ = (Inner *)0x0;
  local_5f8.inner_end_ = (Inner *)0x0;
  local_5f8.it_.ctrl_ = (ctrl_t *)0x0;
  local_5f8.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_5f8.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_5f8.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_5f8.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_5f8.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_5f8.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&local_5f8);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_5b0);
  local_5f8.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_5f8.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5b0);
  lVar18 = 0x50;
  do {
    *(undefined8 *)((long)&local_5f8.inner_end_ + lVar18) = 0;
    *(undefined8 *)((long)&local_5f8.it_.ctrl_ + lVar18) = 0;
    *(undefined8 *)((long)&uStack_600 + lVar18) = 0;
    *(undefined8 *)((long)&local_5f8.inner_ + lVar18) = 0;
    *(undefined8 *)((long)&local_5f8.it_.field_1 + lVar18) = 0;
    *(undefined1 **)((long)&local_5f8.it_end_.ctrl_ + lVar18) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>()
         ::empty_group;
    *(undefined8 *)(local_5b0 + lVar18) = 0;
    *(undefined8 *)((long)&local_5f8.it_end_.field_1 + lVar18) = 0;
    *(undefined8 *)(local_5c0 + lVar18 + -8) = 0;
    *(undefined8 *)(local_5c0 + lVar18) = 0;
    lVar18 = lVar18 + 0x58;
  } while (lVar18 != 0x5d0);
  psVar20 = (slot_type *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  do {
    local_5f8.inner_ = (Inner *)local_5c0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = psVar20;
    local_5f8.inner_end_ = (Inner *)local_5b8;
    local_5c0 = (undefined1  [8])psVar20;
    local_5b8 = (undefined1  [8])psVar20;
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
    ::
    emplace_decomposable_with_hash<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<unsigned_long&&>>
              ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                *)&local_678,local_5b0,(unsigned_long *)local_5f8.inner_,
               SUB168(auVar11 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar11 * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<unsigned_long_&&> *)&local_5f8,
               (tuple<unsigned_long_&&> *)&local_5f8.inner_end_);
    psVar20 = (slot_type *)((long)&(psVar20->value).first._M_dataplus._M_p + 1);
  } while (psVar20 != (slot_type *)0x64);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::iterator::operator++((iterator *)&local_638);
  local_638.first.inner_ = (Inner *)0x0;
  local_638.first.inner_end_ = (Inner *)0x0;
  local_638.first.it_.ctrl_ = (ctrl_t *)0x0;
  local_638.first.it_end_.ctrl_ = (ctrl_t *)0x0;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  local_638.first.it_.ctrl_ = (ctrl_t *)local_678.first.field_2._M_allocated_capacity;
  local_638.first.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.first.field_2._8_8_;
  local_638.first.inner_ = (Inner *)local_678.first._M_dataplus._M_p;
  local_638.first.inner_end_ = (Inner *)local_678.first._M_string_length;
  while (local_638.first.inner_ != (Inner *)0x0) {
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::iterator::operator++((iterator *)&local_638);
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::begin((iterator *)&local_678,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)local_5b0);
  local_638.first.it_end_.ctrl_ = local_678.second._M_dataplus._M_p;
  local_638.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_678.second._M_string_length;
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)local_5b0);
  return 0;
}

Assistant:

int main(int, char **)
{
    using namespace std;

    auto make_int    = [](int i) { return i; };
    auto make_string = [](int i) { return std::to_string(i); };

    auto make_2int    = [](int i) { return std::make_pair(i, i); };
    auto make_2string = [](int i) { return std::make_pair(std::to_string(i), std::to_string(i)); };
    

    test_set<phmap::flat_hash_set<int>>(make_int);
    test_set<phmap::flat_hash_set<string>>(make_string);

    test_set<phmap::node_hash_set<int>>(make_int);
    test_set<phmap::node_hash_set<string>>(make_string);

    test_set<phmap::flat_hash_map<int, int>>(make_2int);
    test_set<phmap::flat_hash_map<string, string>>(make_2string);

    test_set<phmap::node_hash_map<int, int>>(make_2int);
    test_set<phmap::node_hash_map<string, string>>(make_2string);

    test_set<phmap::parallel_flat_hash_set<int>>(make_int);
    test_set<phmap::parallel_flat_hash_set<string>>(make_string);

    test_set<phmap::parallel_node_hash_set<int>>(make_int);
    test_set<phmap::parallel_node_hash_set<string>>(make_string);

    test_set<phmap::parallel_flat_hash_map<int, int>>(make_2int);
    test_set<phmap::parallel_flat_hash_map<string, string>>(make_2string);

    test_set<phmap::parallel_node_hash_map<int, int>>(make_2int);
    test_set<phmap::parallel_node_hash_map<string, string>>(make_2string);

    // example of using default parameters in order to specify the mutex type.
    // 
    // Please be aware that the iterators returned (by find for example) cannot 
    // be safely read in a multithreaded environment. Instead use if_contains(), 
    // which passes a reference value to the callback while holding the submap lock. 
    // Similarly, write access can be done safely using modify_if, try_emplace_l 
    // or lazy_emplace_l.
    // ----------------------------------------------------------------------------
    using Map = phmap::parallel_flat_hash_map<std::size_t, std::size_t,
                                              std::hash<size_t>,
                                              std::equal_to<size_t>, 
                                              std::allocator<std::pair<const size_t, size_t>>, 
                                              4, 
                                              std::mutex>;
    auto make_2size_t    = [](size_t i) { return std::make_pair(i, i); };
    test_set<Map>(make_2size_t);
}